

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_kukakr6r700sixx.cpp
# Opt level: O0

void IKSolver::polyroots3(IkReal *rawcoeffs,IkReal *rawroots,int *numroots)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  runtime_error *this;
  complex<double> *pcVar5;
  double dVar6;
  undefined8 extraout_XMM0_Qa;
  double dVar7;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  undefined8 uVar8;
  complex<double> *local_3b8;
  complex<double> *local_3a0;
  int local_350;
  int local_34c;
  int j_2;
  int n;
  complex<double> newroot;
  int i_3;
  bool visited [3];
  int local_31c;
  undefined1 auStack_318 [4];
  int j_1;
  undefined8 local_310;
  undefined8 local_300;
  int local_2f4;
  undefined1 auStack_2f0 [4];
  int j;
  complex<double> x;
  int i_2;
  bool changed;
  int step;
  int local_2bc;
  undefined1 auStack_2b8 [4];
  int i_1;
  undefined8 local_2b0;
  complex<double> local_2a8;
  undefined8 local_298;
  IkReal err [3];
  undefined1 local_278 [8];
  complex<double> roots [3];
  complex<double> local_240;
  int local_230;
  undefined4 local_22c;
  int i;
  int maxsteps;
  complex<double> coeffs [3];
  IkReal tolsqrt;
  IkReal tol;
  string local_1d8 [48];
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  int *local_20;
  int *numroots_local;
  IkReal *rawroots_local;
  IkReal *rawcoeffs_local;
  
  local_20 = numroots;
  numroots_local = (int *)rawroots;
  rawroots_local = rawcoeffs;
  if ((*rawcoeffs != 0.0) || (NAN(*rawcoeffs))) {
    if ((*rawcoeffs == 0.0) && (!NAN(*rawcoeffs))) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      poVar4 = std::operator<<(local_198,"ikfast exception: ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Simon-Steinmann[P]ikfast_pybind_PR/src/kukakr6r700sixx/ikfast61_kukakr6r700sixx.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x25db);
      poVar4 = std::operator<<(poVar4,": ");
      poVar4 = std::operator<<(poVar4,"polyroots3");
      poVar4 = std::operator<<(poVar4,": Assertion \'");
      poVar4 = std::operator<<(poVar4,"rawcoeffs[0] != 0");
      std::operator<<(poVar4,"\' failed");
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::runtime_error::runtime_error(this,local_1d8);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::numeric_limits<double>::epsilon();
    dVar6 = std::numeric_limits<double>::epsilon();
    dVar6 = sqrt(dVar6);
    local_3a0 = (complex<double> *)&i;
    do {
      std::complex<double>::complex(local_3a0,0.0,0.0);
      local_3a0 = local_3a0 + 1;
    } while (local_3a0 != (complex<double> *)(coeffs[2]._M_value + 8));
    local_22c = 0x6e;
    for (local_230 = 0; local_230 < 3; local_230 = local_230 + 1) {
      std::complex<double>::complex(&local_240,rawroots_local[local_230 + 1] / *rawroots_local,0.0);
      *(undefined8 *)(&i + (long)local_230 * 4) = local_240._M_value._0_8_;
      *(undefined8 *)coeffs[local_230]._M_value = local_240._M_value._8_8_;
    }
    local_3b8 = (complex<double> *)local_278;
    do {
      std::complex<double>::complex(local_3b8,0.0,0.0);
      local_3b8 = local_3b8 + 1;
    } while (local_3b8 != (complex<double> *)(roots[2]._M_value + 8));
    std::complex<double>::complex(&local_2a8,1.0,0.0);
    local_278 = (undefined1  [8])local_2a8._M_value._0_8_;
    roots[0]._M_value._0_8_ = local_2a8._M_value._8_8_;
    uVar8 = 0x3feccccccccccccd;
    std::complex<double>::complex((complex<double> *)auStack_2b8,0.4,0.9);
    roots[0]._M_value._8_8_ = _auStack_2b8;
    roots[1]._M_value._0_8_ = local_2b0;
    local_298 = 0x3ff0000000000000;
    err[0] = 1.0;
    for (local_2bc = 2; local_2bc < 3; local_2bc = local_2bc + 1) {
      std::operator*((complex<double> *)(roots[(long)(local_2bc + -1) + -1]._M_value + 8),
                     (complex<double> *)(roots[0]._M_value + 8));
      *(undefined8 *)(roots[(long)local_2bc + -1]._M_value + 8) = extraout_XMM0_Qa;
      *(undefined8 *)roots[local_2bc]._M_value = uVar8;
      err[(long)local_2bc + -1] = 1.0;
    }
    for (i_2 = 0; i_2 < 0x6e; i_2 = i_2 + 1) {
      bVar2 = false;
      for (x._M_value._12_4_ = 0; (int)x._M_value._12_4_ < 3;
          x._M_value._12_4_ = x._M_value._12_4_ + 1) {
        uVar8 = 0x3d20000000000000;
        if (2.842170943040401e-14 <= err[(long)(int)x._M_value._12_4_ + -1]) {
          bVar2 = true;
          std::operator+((complex<double> *)(roots[(long)(int)x._M_value._12_4_ + -1]._M_value + 8),
                         (complex<double> *)&i);
          x._M_value._0_8_ = uVar8;
          for (local_2f4 = 1; local_2f4 < 3; local_2f4 = local_2f4 + 1) {
            uVar8 = x._M_value._0_8_;
            std::operator*((complex<double> *)
                           (roots[(long)(int)x._M_value._12_4_ + -1]._M_value + 8),
                           (complex<double> *)auStack_2f0);
            local_310 = uVar8;
            std::operator+((complex<double> *)auStack_318,
                           (complex<double> *)(&i + (long)local_2f4 * 4));
            local_300 = uVar8;
            x._M_value._0_8_ = uVar8;
          }
          for (local_31c = 0; local_31c < 3; local_31c = local_31c + 1) {
            if ((x._M_value._12_4_ != local_31c) &&
               (bVar3 = std::operator!=((complex<double> *)
                                        (roots[(long)(int)x._M_value._12_4_ + -1]._M_value + 8),
                                        (complex<double> *)
                                        (roots[(long)local_31c + -1]._M_value + 8)), bVar3)) {
              std::operator-((complex<double> *)
                             (roots[(long)(int)x._M_value._12_4_ + -1]._M_value + 8),
                             (complex<double> *)(roots[(long)local_31c + -1]._M_value + 8));
              std::complex<double>::operator/=
                        ((complex<double> *)auStack_2f0,(complex<double> *)&i_3);
            }
          }
          std::complex<double>::operator-=
                    ((complex<double> *)(roots[(long)(int)x._M_value._12_4_ + -1]._M_value + 8),
                     (complex<double> *)auStack_2f0);
          dVar7 = std::abs<double>((complex<double> *)auStack_2f0);
          err[(long)(int)x._M_value._12_4_ + -1] = dVar7;
        }
      }
      if (!bVar2) break;
    }
    *local_20 = 0;
    memset(newroot._M_value + 0xd,0,3);
    for (newroot._M_value._8_4_ = 0; (int)newroot._M_value._8_4_ < 3;
        newroot._M_value._8_4_ = newroot._M_value._8_4_ + 1) {
      if ((newroot._M_value[(long)(int)newroot._M_value._8_4_ + 0xd] & 1) == 0) {
        _j_2 = *(undefined8 *)(roots[(long)(int)newroot._M_value._8_4_ + -1]._M_value + 8);
        newroot._M_value._0_8_ = *(undefined8 *)roots[(int)newroot._M_value._8_4_]._M_value;
        local_34c = 1;
        local_350 = newroot._M_value._8_4_;
        while (local_350 = local_350 + 1, local_350 < 3) {
          std::real<double>((complex<double> *)
                            (roots[(long)(int)newroot._M_value._8_4_ + -1]._M_value + 8));
          pcVar5 = (complex<double> *)(roots[(long)local_350 + -1]._M_value + 8);
          std::real<double>(pcVar5);
          std::abs((int)pcVar5);
          if (extraout_XMM0_Qa_00 < dVar6) {
            std::imag<double>((complex<double> *)
                              (roots[(long)(int)newroot._M_value._8_4_ + -1]._M_value + 8));
            pcVar5 = (complex<double> *)(roots[(long)local_350 + -1]._M_value + 8);
            std::imag<double>(pcVar5);
            std::abs((int)pcVar5);
            if (extraout_XMM0_Qa_01 < 0.002) {
              std::complex<double>::operator+=
                        ((complex<double> *)&j_2,
                         (complex<double> *)(roots[(long)local_350 + -1]._M_value + 8));
              local_34c = local_34c + 1;
              newroot._M_value[(long)local_350 + 0xd] = 1;
            }
          }
        }
        if (1 < local_34c) {
          std::complex<double>::operator/=((complex<double> *)&j_2,(double)local_34c);
        }
        dVar7 = std::imag<double>((complex<double> *)&j_2);
        dVar7 = IKabs(dVar7);
        if (dVar7 < dVar6) {
          dVar7 = std::real<double>((complex<double> *)&j_2);
          iVar1 = *local_20;
          *local_20 = iVar1 + 1;
          *(double *)(numroots_local + (long)iVar1 * 2) = dVar7;
        }
      }
    }
  }
  else {
    polyroots2(rawcoeffs + 1,rawroots,numroots);
  }
  return;
}

Assistant:

static inline void polyroots3(IkReal rawcoeffs[3+1], IkReal rawroots[3], int& numroots)
{
    using std::complex;
    if( rawcoeffs[0] == 0 ) {
        // solve with one reduced degree
        polyroots2(&rawcoeffs[1], &rawroots[0], numroots);
        return;
    }
    IKFAST_ASSERT(rawcoeffs[0] != 0);
    const IkReal tol = 128.0*std::numeric_limits<IkReal>::epsilon();
    const IkReal tolsqrt = sqrt(std::numeric_limits<IkReal>::epsilon());
    complex<IkReal> coeffs[3];
    const int maxsteps = 110;
    for(int i = 0; i < 3; ++i) {
        coeffs[i] = complex<IkReal>(rawcoeffs[i+1]/rawcoeffs[0]);
    }
    complex<IkReal> roots[3];
    IkReal err[3];
    roots[0] = complex<IkReal>(1,0);
    roots[1] = complex<IkReal>(0.4,0.9); // any complex number not a root of unity works
    err[0] = 1.0;
    err[1] = 1.0;
    for(int i = 2; i < 3; ++i) {
        roots[i] = roots[i-1]*roots[1];
        err[i] = 1.0;
    }
    for(int step = 0; step < maxsteps; ++step) {
        bool changed = false;
        for(int i = 0; i < 3; ++i) {
            if ( err[i] >= tol ) {
                changed = true;
                // evaluate
                complex<IkReal> x = roots[i] + coeffs[0];
                for(int j = 1; j < 3; ++j) {
                    x = roots[i] * x + coeffs[j];
                }
                for(int j = 0; j < 3; ++j) {
                    if( i != j ) {
                        if( roots[i] != roots[j] ) {
                            x /= (roots[i] - roots[j]);
                        }
                    }
                }
                roots[i] -= x;
                err[i] = abs(x);
            }
        }
        if( !changed ) {
            break;
        }
    }

    numroots = 0;
    bool visited[3] = {false};
    for(int i = 0; i < 3; ++i) {
        if( !visited[i] ) {
            // might be a multiple root, in which case it will have more error than the other roots
            // find any neighboring roots, and take the average
            complex<IkReal> newroot=roots[i];
            int n = 1;
            for(int j = i+1; j < 3; ++j) {
                // care about error in real much more than imaginary
                if( abs(real(roots[i])-real(roots[j])) < tolsqrt && abs(imag(roots[i])-imag(roots[j])) < 0.002 ) {
                    newroot += roots[j];
                    n += 1;
                    visited[j] = true;
                }
            }
            if( n > 1 ) {
                newroot /= n;
            }
            // there are still cases where even the mean is not accurate enough, until a better multi-root algorithm is used, need to use the sqrt
            if( IKabs(imag(newroot)) < tolsqrt ) {
                rawroots[numroots++] = real(newroot);
            }
        }
    }
}